

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O2

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<int,_std::allocator<int>_> *output)

{
  pointer piVar1;
  bool bVar2;
  int iVar3;
  AVSValue *pAVar4;
  undefined8 *puVar5;
  int index;
  int local_3c;
  AVSValue arg;
  
  iVar3 = NameToIndex(this,name);
  pAVar4 = AVSValue::operator[](&this->_args,iVar3);
  AVSValue::AVSValue(&arg,pAVar4);
  bVar2 = AVSValue::IsArray(&arg);
  if (bVar2) {
    iVar3 = AVSValue::ArraySize(&arg);
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if ((output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar1) {
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar1;
    }
    index = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != index; index = index + 1) {
      pAVar4 = AVSValue::operator[](&arg,index);
      local_3c = AVSValue::AsInt(pAVar4);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_3c);
    }
    AVSValue::~AVSValue(&arg);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Argument is not array";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<int>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsInt());
    }